

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,Index t,Index *jaIs,Index *joIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  const_reference pvVar4;
  size_t nrO;
  size_t nrA;
  ulong i;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [64];
  undefined1 extraout_var_00 [56];
  
  pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (&this->_m_firstJAOHIforT,(ulong)t);
  uVar7 = jaohI - *pvVar4;
  nrO = (**(code **)((long)*this->_m_madp + 200))();
  nrA = (**(code **)((long)*this->_m_madp + 0x68))();
  auVar9._8_56_ = extraout_var;
  auVar9._0_8_ = extraout_XMM0_Qa;
  iVar6 = t - 1;
  lVar8 = 0;
  auVar2 = vcvtusi2sd_avx512f(auVar9._0_16_,nrA * nrO);
  for (; (ulong)t << 2 != lVar8; lVar8 = lVar8 + 4) {
    auVar1 = vcvtusi2sd_avx512f(in_XMM2,iVar6);
    auVar10._0_8_ = pow(auVar2._0_8_,auVar1._0_8_);
    auVar10._8_56_ = extraout_var_00;
    uVar5 = vcvttsd2usi_avx512f(auVar10._0_16_);
    i = uVar7 / uVar5;
    uVar7 = uVar7 % uVar5;
    IVar3 = Globals::CastLIndexToIndex(i);
    IVar3 = IndexTools::ActionObservation_to_ActionIndex(IVar3,nrA,nrO);
    *(Index *)((long)jaIs + lVar8) = IVar3;
    IVar3 = Globals::CastLIndexToIndex(i);
    IVar3 = IndexTools::ActionObservation_to_ObservationIndex(IVar3,nrA,nrO);
    iVar6 = iVar6 + -1;
    *(Index *)((long)joIs + lVar8) = IVar3;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryArrays
    (LIndex jaohI, Index t,  Index jaIs[], Index joIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    LIndex jaohIwithinThisT = jaohI - _m_firstJAOHIforT.at(t);
   
    LIndex remainder = jaohIwithinThisT;
    size_t vec_size = t; // the number of 'JAO' we are searching
        //note: this was t+1, but that is incorrect(?)!
        
    size_t nrJO = GetNrJointObservations();
    size_t nrJA = GetNrJointActions();
    size_t nrJAO = nrJO*nrJA;
//    Index jao_array[vec_size];
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // suppose we have a jaoh = < jaoI[3], jaoI[2], jao[1], jaoI[0] >
        // (the numbers represent the stage of the jaoI)
        // ->then this history is for stage 4 (we have that t=4).
        //
        // the jaohI is generated by: 
        //      jaohI= jaoI[3] * nrJAO^3 + ... +jaoI[0] * nrJAO^0
        //
        // we reconstruct this by performing
        // jaoI[3] = jaohI /  nrJAO^3
        // remainder = jaohI - (jaoI^3)
        // jaoI[2] = remainder / nrJAO^2
        // etc.
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrJAO, (double)(stage));

        LIndex jaoI_t2 = remainder / b;
//        jao_array[t2] = jaoI_t2;
        remainder -= jaoI_t2 * b;

        jaIs[t2] = IndexTools::
            ActionObservation_to_ActionIndex(CastLIndexToIndex(jaoI_t2), nrJA, nrJO);
        joIs[t2] = IndexTools::
            ActionObservation_to_ObservationIndex(CastLIndexToIndex(jaoI_t2), nrJA, nrJO);
    }

}